

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O3

void __thiscall State::Reset(State *this)

{
  _Hash_node_base *p_Var1;
  pointer ppEVar2;
  Edge *pEVar3;
  _Hash_node_base *p_Var4;
  pointer ppEVar5;
  
  for (p_Var4 = (this->paths_)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
      p_Var4 = p_Var4->_M_nxt) {
    p_Var1 = p_Var4[3]._M_nxt;
    p_Var1[5]._M_nxt = (_Hash_node_base *)0xffffffffffffffff;
    *(undefined1 *)&p_Var1[6]._M_nxt = 0;
  }
  ppEVar2 = (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar5 = (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppEVar5 != ppEVar2; ppEVar5 = ppEVar5 + 1) {
    pEVar3 = *ppEVar5;
    pEVar3->outputs_ready_ = false;
    pEVar3->deps_loaded_ = false;
    pEVar3->mark_ = VisitNone;
  }
  return;
}

Assistant:

void State::Reset() {
  for (Paths::iterator i = paths_.begin(); i != paths_.end(); ++i)
    i->second->ResetState();
  for (vector<Edge*>::iterator e = edges_.begin(); e != edges_.end(); ++e) {
    (*e)->outputs_ready_ = false;
    (*e)->deps_loaded_ = false;
    (*e)->mark_ = Edge::VisitNone;
  }
}